

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDataDependenceAnalysis.cpp
# Opt level: O2

vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> * __thiscall
dg::dda::LLVMDataDependenceAnalysis::getLLVMDefinitions
          (vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *__return_storage_ptr__,
          LLVMDataDependenceAnalysis *this,Value *use)

{
  int iVar1;
  RWNode *pRVar2;
  undefined4 extraout_var;
  raw_ostream *prVar3;
  char *Str;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> rdDefs;
  Value *local_48;
  _Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> local_40;
  
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar2 = getNode(this,use);
  if (pRVar2 == (RWNode *)0x0) {
    prVar3 = (raw_ostream *)llvm::errs();
    Str = "[DDA] error: no node for: ";
  }
  else {
    iVar1 = (*pRVar2->_vptr_RWNode[2])(pRVar2);
    if (*(long *)(CONCAT44(extraout_var,iVar1) + 0x88) != 0) {
      if ((use[0x10] != (Value)0x3b) && (use[0x10] != (Value)0x53)) {
        prVar3 = (raw_ostream *)llvm::errs();
        prVar3 = llvm::raw_ostream::operator<<
                           (prVar3,"[DDA] error: the queried value is not a use: ");
        prVar3 = llvm::operator<<(prVar3,use);
        llvm::raw_ostream::operator<<(prVar3,"\n");
      }
      (**(code **)(*(long *)**(undefined8 **)(this + 0xb8) + 0x20))
                (&local_40,(long *)**(undefined8 **)(this + 0xb8),pRVar2);
      for (; local_40._M_impl.super__Vector_impl_data._M_start !=
             local_40._M_impl.super__Vector_impl_data._M_finish;
          local_40._M_impl.super__Vector_impl_data._M_start =
               local_40._M_impl.super__Vector_impl_data._M_start + 1) {
        local_48 = getValue(this,*local_40._M_impl.super__Vector_impl_data._M_start);
        std::vector<llvm::Value*,std::allocator<llvm::Value*>>::emplace_back<llvm::Value*>
                  ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)__return_storage_ptr__,
                   &local_48);
      }
      std::_Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~_Vector_base
                (&local_40);
      return __return_storage_ptr__;
    }
    prVar3 = (raw_ostream *)llvm::errs();
    Str = "[DDA] error: the queried value has empty uses: ";
  }
  prVar3 = llvm::raw_ostream::operator<<(prVar3,Str);
  prVar3 = llvm::operator<<(prVar3,use);
  llvm::raw_ostream::operator<<(prVar3,"\n");
  return __return_storage_ptr__;
}

Assistant:

std::vector<llvm::Value *>
LLVMDataDependenceAnalysis::getLLVMDefinitions(llvm::Value *use) {
    std::vector<llvm::Value *> defs;

    auto *loc = getNode(use);
    if (!loc) {
        llvm::errs() << "[DDA] error: no node for: " << *use << "\n";
        return defs;
    }

    if (loc->getUses().empty()) {
        llvm::errs() << "[DDA] error: the queried value has empty uses: "
                     << *use << "\n";
        return defs;
    }

    if (!llvm::isa<llvm::LoadInst>(use) && !llvm::isa<llvm::CallInst>(use)) {
        llvm::errs() << "[DDA] error: the queried value is not a use: " << *use
                     << "\n";
    }

    auto rdDefs = getDefinitions(loc);
#ifndef NDEBUG
    if (rdDefs.empty()) {
        if (!loc->usesOnlyGlobals()) {
            static std::set<const llvm::Value *> reported;
            if (reported.insert(use).second) {
                llvm::errs()
                        << "[DDA] warn: no definitions for: " << *use << "\n";
            }
        }
    }
#endif // NDEBUG

    // map the values
    for (RWNode *nd : rdDefs) {
        assert(nd->getType() != RWNodeType::PHI);
        const auto *llvmvalue = getValue(nd);
        assert(llvmvalue && "Have no value for a node");
        defs.push_back(const_cast<llvm::Value *>(llvmvalue));
    }

    return defs;
}